

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Histogram
               (Image *image,uint32_t x,uint32_t y,Image *mask,uint32_t maskX,uint32_t maskY,
               uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  pointer puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  ulong uVar9;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,mask,maskX,maskY,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,mask);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,mask);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,image,&local_80);
  this = histogram;
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,0x100);
  puVar4 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar5 = puVar3; puVar5 != puVar4; puVar5 = puVar5 + 1) {
    *puVar5 = 0;
  }
  uVar1 = image->_rowSize;
  uVar2 = mask->_rowSize;
  puVar6 = image->_data + (ulong)x + (ulong)(y * uVar1);
  puVar7 = mask->_data + (ulong)maskX + (ulong)(maskY * uVar2);
  puVar8 = puVar6 + height * uVar1;
  for (; puVar6 != puVar8; puVar6 = puVar6 + uVar1) {
    for (uVar9 = 0; width != uVar9; uVar9 = uVar9 + 1) {
      if (puVar7[uVar9] != '\0') {
        puVar4 = puVar3 + puVar6[uVar9];
        *puVar4 = *puVar4 + 1;
      }
    }
    puVar7 = puVar7 + uVar2;
  }
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, const Image & mask, uint32_t maskX, uint32_t maskY, uint32_t width, uint32_t height,
                    std::vector < uint32_t > & histogram )
    {
        ParameterValidation( image, x, y, mask, maskX, maskY, width, height );
        VerifyGrayScaleImage( image, mask );
        OptimiseRoi( width, height, image, mask );

        histogram.resize( 256u );
        std::fill( histogram.begin(), histogram.end(), 0u );

        const uint32_t rowSize     = image.rowSize();
        const uint32_t rowSizeMask = mask.rowSize();

        const uint8_t * imageY     = image.data() + y * rowSize + x;
        const uint8_t * imageYMask = mask.data() + maskY * rowSizeMask + maskX;
        const uint8_t * imageYEnd  = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize, imageYMask += rowSizeMask ) {
            const uint8_t * imageX     = imageY;
            const uint8_t * imageXMask = imageYMask;
            const uint8_t * imageXEnd  = imageX + width;

            for( ; imageX != imageXEnd; ++imageX, ++imageXMask ) {
                if( (*imageXMask) > 0 )
                    ++histogram[*imageX];
            }
        }
    }